

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

Cba_Man_t * Cba_ManDup(Cba_Man_t *p,_func_Vec_Int_t_ptr_Cba_Ntk_t_ptr *pFuncOrder)

{
  char *pFileName;
  int iVar1;
  Abc_Nam_t *pStrs;
  Abc_Nam_t *pFuns;
  Abc_Nam_t *pMods;
  Hash_IntMan_t *vHash;
  Cba_Man_t *pNew_00;
  Cba_Ntk_t *p_00;
  Cba_Ntk_t *pNtk_00;
  Cba_Man_t *pNew;
  int i;
  Cba_Ntk_t *pNtkNew;
  Cba_Ntk_t *pNtk;
  _func_Vec_Int_t_ptr_Cba_Ntk_t_ptr *pFuncOrder_local;
  Cba_Man_t *p_local;
  
  pFileName = p->pSpec;
  iVar1 = Cba_ManNtkNum(p);
  pStrs = Abc_NamRef(p->pStrs);
  pFuns = Abc_NamRef(p->pFuns);
  pMods = Abc_NamStart(100,0x18);
  vHash = Hash_IntManRef(p->vHash);
  pNew_00 = Cba_ManAlloc(pFileName,iVar1,pStrs,pFuns,pMods,vHash);
  Cba_ManDupTypeNames(pNew_00,p);
  for (pNew._4_4_ = 1; iVar1 = Cba_ManNtkNum(p), pNew._4_4_ <= iVar1; pNew._4_4_ = pNew._4_4_ + 1) {
    p_00 = Cba_ManNtk(p,pNew._4_4_);
    pNtk_00 = Cba_NtkDupOrder(pNew_00,p_00,pFuncOrder);
    Cba_NtkAdd(pNew_00,pNtk_00);
    Cba_NtkDupAttrs(pNtk_00,p_00);
  }
  iVar1 = Cba_ManNtkNum(pNew_00);
  pNew_00->iRoot = iVar1;
  return pNew_00;
}

Assistant:

static inline Cba_Man_t * Cba_ManDup( Cba_Man_t * p, Vec_Int_t*(* pFuncOrder)(Cba_Ntk_t*) )
{
    Cba_Ntk_t * pNtk, * pNtkNew; int i;
    Cba_Man_t * pNew = Cba_ManAlloc( p->pSpec, Cba_ManNtkNum(p), Abc_NamRef(p->pStrs), Abc_NamRef(p->pFuns), Abc_NamStart(100, 24), Hash_IntManRef(p->vHash) );
    Cba_ManDupTypeNames( pNew, p );
    Cba_ManForEachNtk( p, pNtk, i )
    {
        pNtkNew = Cba_NtkDupOrder( pNew, pNtk, pFuncOrder );
        Cba_NtkAdd( pNew, pNtkNew );
        Cba_NtkDupAttrs( pNtkNew, pNtk );
    }
//    Cba_ManForEachNtk( p, pNtk, i )
//        if ( (pHost = Cba_NtkHostNtk(pNtk)) )
//            Cba_NtkSetHost( Cba_NtkCopyNtk(pNew, pNtk), Cba_NtkCopy(pHost), Cba_ObjCopy(pHost, Cba_NtkHostObj(pNtk)) );
    pNew->iRoot = Cba_ManNtkNum(pNew);
    return pNew;
}